

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalFirst<false,false>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string *this_00;
  reference this_01;
  pointer pEVar1;
  LogicalType *type;
  LogicalType decimal_type;
  type name;
  LogicalType LStack_188;
  string local_170 [32];
  AggregateFunction local_150;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_01);
  LogicalType::LogicalType(&LStack_188,&pEVar1->return_type);
  this_00 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name;
  ::std::__cxx11::string::string(local_170,(string *)this_00);
  GetFirstFunction<false,false>(&local_150,(duckdb *)&LStack_188,type);
  AggregateFunction::operator=(function,&local_150);
  AggregateFunction::~AggregateFunction(&local_150);
  ::std::__cxx11::string::operator=((string *)this_00,local_170);
  function->distinct_dependent = NOT_DISTINCT_DEPENDENT;
  LogicalType::operator=(&(function->super_BaseScalarFunction).return_type,&LStack_188);
  *(undefined8 *)this = 0;
  ::std::__cxx11::string::~string(local_170);
  LogicalType::~LogicalType(&LStack_188);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalFirst(ClientContext &context, AggregateFunction &function,
                                          vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto name = std::move(function.name);
	function = GetFirstFunction<LAST, SKIP_NULLS>(decimal_type);
	function.name = std::move(name);
	function.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	function.return_type = decimal_type;
	return nullptr;
}